

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp-mpiu.c
# Opt level: O3

void * MPIU_Scatter(MPI_Comm comm,int root,void *sendbuffer,void *recvbuffer,int nrecv,size_t elsize
                   ,int *totalnsend)

{
  void *pvVar1;
  undefined8 uVar2;
  void *pvVar3;
  int iVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  undefined4 in_register_00000034;
  long lVar8;
  long lVar9;
  long lVar10;
  undefined8 auStack_a0 [5];
  undefined8 local_78;
  MPI_Datatype dtype;
  void *local_68;
  void *local_60;
  undefined1 *local_58;
  size_t local_50;
  undefined8 local_48;
  int local_3c;
  uint local_38;
  int ThisTask;
  int NTask;
  int nrecv_local;
  
  local_48 = CONCAT44(in_register_00000034,root);
  auStack_a0[4] = 0x105f58;
  local_68 = recvbuffer;
  local_60 = sendbuffer;
  ThisTask = nrecv;
  MPI_Comm_size();
  auStack_a0[4] = 0x105f64;
  MPI_Comm_rank(comm,&local_3c);
  auStack_a0[4] = 0x105f7d;
  local_50 = elsize;
  MPI_Type_contiguous(elsize & 0xffffffff,&ompi_mpi_byte,&local_78);
  auStack_a0[4] = 0x105f85;
  MPI_Type_commit(&local_78);
  lVar10 = (long)&local_78 - ((ulong)local_38 * 4 + 0xf & 0xfffffffffffffff0);
  uVar7 = (ulong)(local_38 + 1) * 4 + 0xf & 0xfffffffffffffff0;
  lVar9 = lVar10 - uVar7;
  dtype = (MPI_Datatype)comm;
  local_58 = (undefined1 *)&local_78;
  *(MPI_Comm *)(lVar9 + -8) = comm;
  *(undefined8 *)(lVar9 + -0x10) = local_48;
  *(undefined8 *)(lVar9 + -0x18) = 0x105feb;
  MPI_Gather(&ThisTask,1,&ompi_mpi_int,lVar10,1,&ompi_mpi_int);
  *(undefined4 *)(lVar10 - uVar7) = 0;
  uVar7 = (ulong)local_38;
  if (0 < (int)local_38) {
    uVar5 = 0;
    iVar6 = 0;
    do {
      iVar6 = iVar6 + *(int *)(lVar10 + uVar5 * 4);
      *(int *)(lVar9 + 4 + uVar5 * 4) = iVar6;
      uVar5 = uVar5 + 1;
    } while (uVar7 != uVar5);
  }
  pvVar3 = local_68;
  if (local_68 == (void *)0x0) {
    lVar8 = (long)ThisTask * local_50;
    *(undefined8 *)(lVar9 + -8) = 0x106049;
    pvVar3 = (void *)(*(code *)_MPIUMem_0)
                               ("recvbuffer",lVar8,
                                "/workspace/llm4binary/github/license_c_cmakelists/rainwoodman[P]bigfile/src/mp-mpiu.c"
                                ,0x14f,_MPIUMem_2);
  }
  iVar6 = ThisTask;
  uVar2 = local_48;
  pvVar1 = local_60;
  if (local_3c == (int)local_48) {
    if (totalnsend == (int *)0x0) goto LAB_00106072;
    iVar4 = *(int *)(lVar9 + (long)(int)local_38 * 4);
  }
  else {
    iVar4 = 0;
    if (totalnsend == (int *)0x0) goto LAB_00106072;
  }
  *totalnsend = iVar4;
LAB_00106072:
  *(MPI_Datatype *)(lVar9 + -0x10) = dtype;
  *(undefined8 *)(lVar9 + -0x18) = uVar2;
  *(undefined8 *)(lVar9 + -0x20) = local_78;
  *(undefined8 *)(lVar9 + -0x28) = 0x106099;
  MPI_Scatterv(pvVar1,lVar10,lVar9,local_78,pvVar3,iVar6);
  *(undefined8 *)(lVar9 + -8) = 0x1060a5;
  MPI_Type_free(&local_78);
  return pvVar3;
}

Assistant:

void *
MPIU_Scatter (MPI_Comm comm, int root, const void * sendbuffer, void * recvbuffer, int nrecv, size_t elsize, int * totalnsend)
{
    int NTask;
    int ThisTask;
    MPI_Comm_size(comm, &NTask);
    MPI_Comm_rank(comm, &ThisTask);

    MPI_Datatype dtype;
    MPI_Type_contiguous(elsize, MPI_BYTE, &dtype);
    MPI_Type_commit(&dtype);

    int sendcount[NTask];
    int sdispls[NTask + 1];
    int i;

    MPI_Gather(&nrecv, 1, MPI_INT, sendcount, 1, MPI_INT, root, comm);

    sdispls[0] = 0;
    for(i = 1; i <= NTask; i ++) {
        sdispls[i] = sdispls[i - 1] + sendcount[i - 1];
    }

    if(recvbuffer == NULL)
        recvbuffer = MPIU_Malloc("recvbuffer", elsize, nrecv);

    if(ThisTask == root) {
        if(totalnsend)
            *totalnsend = sdispls[NTask];
    } else {
        if(totalnsend)
            *totalnsend = 0;
    }
    MPI_Scatterv(sendbuffer, sendcount, sdispls, dtype, recvbuffer, nrecv, dtype, root, comm);

    MPI_Type_free(&dtype);

    return recvbuffer;
}